

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SList.h
# Opt level: O0

bool __thiscall
SListBase<void_*,_Memory::ArenaAllocator,_RealCount>::Has
          (SListBase<void_*,_Memory::ArenaAllocator,_RealCount> *this,void *data)

{
  code *pcVar1;
  undefined1 this_00 [8];
  bool bVar2;
  undefined4 *puVar3;
  Type_conflict node;
  Type *ppvVar4;
  undefined1 local_40 [8];
  Iterator iter;
  void *data_local;
  SListBase<void_*,_Memory::ArenaAllocator,_RealCount> *this_local;
  
  iter.current = (NodeBase *)data;
  Iterator::Iterator((Iterator *)local_40,this);
  while( true ) {
    if (iter.list == (SListBase<void_*,_Memory::ArenaAllocator,_RealCount> *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar3 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/SList.h"
                         ,0x76,"(current != nullptr)","current != nullptr");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar3 = 0;
    }
    this_00 = local_40;
    node = SListNodeBase<Memory::ArenaAllocator>::Next
                     (&(iter.list)->super_SListNodeBase<Memory::ArenaAllocator>);
    bVar2 = IsHead((SListBase<void_*,_Memory::ArenaAllocator,_RealCount> *)this_00,node);
    if (bVar2) break;
    iter.list = (SListBase<void_*,_Memory::ArenaAllocator,_RealCount> *)
                SListNodeBase<Memory::ArenaAllocator>::Next
                          (&(iter.list)->super_SListNodeBase<Memory::ArenaAllocator>);
    ppvVar4 = Iterator::Data((Iterator *)local_40);
    if ((NodeBase *)*ppvVar4 == iter.current) {
      return true;
    }
  }
  return false;
}

Assistant:

bool Has(TData data) const
    {
        Iterator iter(this);
        while (iter.Next())
        {
            if (iter.Data() == data)
            {
                return true;
            }
        }
        return false;
    }